

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

_Bool borg_quaff_unknown(void)

{
  char *what;
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((ulong)z_info->pack_size == 0) {
    uVar3 = 0xffffffff;
  }
  else {
    puVar1 = &borg_items->iqty;
    uVar4 = 0xffffffff;
    uVar2 = 0;
    do {
      if (((*puVar1 != '\0') && (puVar1[-4] == '\x1a')) && (*(uint32_t *)(puVar1 + -0xc) == 0)) {
        uVar4 = uVar2 & 0xffffffff;
      }
      uVar3 = (uint)uVar4;
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 0x388;
    } while (z_info->pack_size != uVar2);
  }
  if (-1 < (int)uVar3) {
    what = format("# Quaffing unknown potion %s.",borg_items + uVar3);
    borg_note(what);
    borg_keypress(0x71);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar3]);
    goal_item = -1;
    goal_ware = -1;
    goal_shop = -1;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool borg_quaff_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_POTION)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Quaffing unknown potion %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('q');
    borg_keypress(all_letters_nohjkl[n]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}